

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

void __thiscall
r_exec::IPGMContext::copy_structure_to_value_array
          (IPGMContext *this,bool prefix,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr)

{
  ushort uVar1;
  Atom *pAVar2;
  char cVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  Operator *pOVar7;
  Atom *pAVar8;
  uint16_t uVar9;
  ushort uVar10;
  
  cVar3 = r_code::Atom::getDescriptor();
  if (cVar3 == -0x3b) {
    uVar5 = r_code::Atom::asOpcode();
    pOVar7 = r_code::vector<r_exec::Operator>::operator[]
                       ((vector<r_exec::Operator> *)Operator::Operators,(ulong)uVar5);
    if (pOVar7->_operator == syn) {
      copy_member_to_value_array(this,1,prefix,write_index,extent_index,dereference_cptr);
      return;
    }
  }
  iVar6 = (*(this->super__Context)._vptr__Context[6])(this);
  uVar5 = (this->super__Context).index;
  pAVar2 = (this->super__Context).code;
  pAVar8 = r_code::vector<r_code::Atom>::operator[]
                     (&((this->super__Context).overlay)->values,(ulong)write_index);
  r_code::Atom::operator=(pAVar8,pAVar2 + (ulong)uVar5 * 4);
  uVar5 = (ushort)iVar6;
  *extent_index = uVar5 + write_index + 1;
  cVar3 = r_code::Atom::getDescriptor();
  if (cVar3 == -0x40) {
    if (!dereference_cptr) {
      copy_member_to_value_array(this,1,prefix,write_index + 1,extent_index,false);
      if (uVar5 < 2) {
        return;
      }
      uVar10 = 2;
      do {
        uVar1 = (this->super__Context).index;
        pAVar2 = (this->super__Context).code;
        pAVar8 = r_code::vector<r_code::Atom>::operator[]
                           (&((this->super__Context).overlay)->values,
                            (ulong)(ushort)(write_index + uVar10));
        r_code::Atom::operator=(pAVar8,pAVar2 + (ulong)uVar10 * 4 + (ulong)uVar1 * 4);
        uVar10 = uVar10 + 1;
      } while (uVar10 <= uVar5);
      return;
    }
  }
  else if (cVar3 == -0x39) {
    if (uVar5 == 0) {
      return;
    }
    uVar10 = 1;
    do {
      uVar1 = (this->super__Context).index;
      pAVar2 = (this->super__Context).code;
      pAVar8 = r_code::vector<r_code::Atom>::operator[]
                         (&((this->super__Context).overlay)->values,
                          (ulong)(ushort)(write_index + uVar10));
      r_code::Atom::operator=(pAVar8,pAVar2 + (ulong)uVar10 * 4 + (ulong)uVar1 * 4);
      uVar10 = uVar10 + 1;
    } while (uVar10 <= uVar5);
    return;
  }
  bVar4 = is_cmd_with_cptr(this);
  if (bVar4) {
    if (uVar5 != 0) {
      uVar9 = 1;
      do {
        copy_member_to_value_array(this,uVar9,prefix,write_index + uVar9,extent_index,uVar9 != 2);
        uVar9 = uVar9 + 1;
      } while (uVar9 <= uVar5);
    }
  }
  else if (uVar5 != 0) {
    uVar9 = 1;
    do {
      copy_member_to_value_array
                (this,uVar9,prefix,write_index + uVar9,extent_index,uVar9 != 1 || dereference_cptr);
      uVar9 = uVar9 + 1;
    } while (uVar9 <= uVar5);
  }
  return;
}

Assistant:

void IPGMContext::copy_structure_to_value_array(bool prefix, uint16_t write_index, uint16_t &extent_index, bool dereference_cptr)   // prefix: by itpr or not.
{
    if (code[index].getDescriptor() == Atom::OPERATOR && Operator::Get(code[index].asOpcode()).is_syn()) {
        copy_member_to_value_array(1, prefix, write_index, extent_index, dereference_cptr);
    } else {
        uint16_t atom_count = getChildrenCount();
        overlay->values[write_index++] = code[index];
        extent_index = write_index + atom_count;

        switch (code[index].getDescriptor()) {
        case Atom::TIMESTAMP:
            for (uint16_t i = 1; i <= atom_count; ++i) {
                overlay->values[write_index++] = code[index + i];
            }

            break;

        case Atom::C_PTR:
            if (!dereference_cptr) {
                copy_member_to_value_array(1, prefix, write_index++, extent_index, false);

                for (uint16_t i = 2; i <= atom_count; ++i) {
                    overlay->values[write_index++] = code[index + i];
                }

                //Atom::Trace(&overlay->values[0],overlay->values.size());
                break;
            } // else, dereference the c_ptr.

        default:
            if (is_cmd_with_cptr()) {
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    copy_member_to_value_array(i, prefix, write_index++, extent_index, i != 2);
                }
            } else {
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    copy_member_to_value_array(i, prefix, write_index++, extent_index, !(!dereference_cptr && i == 1));
                }
            }
        }
    }
}